

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

int lua_getstack(lua_State *L,int level,lua_Debug *ar)

{
  cTValue *pcVar1;
  long in_RDX;
  int in_ESI;
  lua_State *in_RDI;
  cTValue *frame;
  int size;
  int local_24;
  long local_20;
  int local_14;
  lua_State *local_10;
  uint local_4;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  pcVar1 = lj_debug_frame(in_RDI,in_ESI,&local_24);
  if (pcVar1 == (cTValue *)0x0) {
    *(int *)(local_20 + 0x74) = local_14 - local_24;
  }
  else {
    *(int *)(local_20 + 0x74) =
         local_24 * 0x10000 + (int)((long)((long)pcVar1 - (ulong)(local_10->stack).ptr32) >> 3);
  }
  local_4 = (uint)(pcVar1 != (cTValue *)0x0);
  return local_4;
}

Assistant:

LUA_API int lua_getstack(lua_State *L, int level, lua_Debug *ar)
{
  int size;
  cTValue *frame = lj_debug_frame(L, level, &size);
  if (frame) {
    ar->i_ci = (size << 16) + (int)(frame - tvref(L->stack));
    return 1;
  } else {
    ar->i_ci = level - size;
    return 0;
  }
}